

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,Options *options)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  iterator __first;
  iterator __last;
  FieldDescriptor *descriptor_00;
  FieldDescriptor *field;
  int i_1;
  int presence_bit_count;
  FieldDescriptor *local_38;
  int local_30;
  int i;
  Options *local_20;
  Options *options_local;
  Descriptor *descriptor_local;
  MessageGenerator *this_local;
  
  local_20 = options;
  options_local = (Options *)descriptor;
  descriptor_local = (Descriptor *)this;
  SourceGeneratorBase::SourceGeneratorBase(&this->super_SourceGeneratorBase,options);
  (this->super_SourceGeneratorBase)._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__MessageGenerator_008e70a0;
  this->descriptor_ = (Descriptor *)options_local;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&this->fields_by_number_);
  this->has_bit_field_count_ = 0;
  uVar2 = GetGroupEndTag((Descriptor *)options_local);
  this->end_tag_ = uVar2;
  iVar3 = Descriptor::extension_range_count((Descriptor *)options_local);
  this->has_extension_ranges_ = 0 < iVar3;
  for (local_30 = 0; iVar3 = local_30, iVar4 = Descriptor::field_count(this->descriptor_),
      iVar3 < iVar4; local_30 = local_30 + 1) {
    local_38 = Descriptor::field(this->descriptor_,local_30);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back(&this->fields_by_number_,&local_38);
  }
  __first = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::begin(&this->fields_by_number_);
  __last = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::end(&this->fields_by_number_);
  std::
  sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>
            ((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              )__first._M_current,
             (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              )__last._M_current,CompareFieldNumbers);
  field._4_4_ = 0;
  for (field._0_4_ = 0; iVar3 = Descriptor::field_count(this->descriptor_), (int)field < iVar3;
      field._0_4_ = (int)field + 1) {
    descriptor_00 = Descriptor::field(this->descriptor_,(int)field);
    bVar1 = RequiresPresenceBit(descriptor_00);
    if ((bVar1) &&
       ((field._4_4_ = field._4_4_ + 1, this->has_bit_field_count_ == 0 || (field._4_4_ % 0x20 == 0)
        ))) {
      this->has_bit_field_count_ = this->has_bit_field_count_ + 1;
    }
  }
  return;
}

Assistant:

MessageGenerator::MessageGenerator(const Descriptor* descriptor,
                                   const Options* options)
    : SourceGeneratorBase(options),
      descriptor_(descriptor),
      has_bit_field_count_(0),
      end_tag_(GetGroupEndTag(descriptor)),
      has_extension_ranges_(descriptor->extension_range_count() > 0) {
  // fields by number
  for (int i = 0; i < descriptor_->field_count(); i++) {
    fields_by_number_.push_back(descriptor_->field(i));
  }
  std::sort(fields_by_number_.begin(), fields_by_number_.end(),
            CompareFieldNumbers);

  int presence_bit_count = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (RequiresPresenceBit(field)) {
      presence_bit_count++;
      if (has_bit_field_count_ == 0 || (presence_bit_count % 32) == 0) {
        has_bit_field_count_++;
      }
    }
  }
}